

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_resources.cpp
# Opt level: O0

bool dxil_spv::emit_cbuffer_load_root_constant(Impl *impl,CallInst *instruction)

{
  Id base_ptr;
  bool bVar1;
  mapped_type *pmVar2;
  Value *local_20;
  CallInst *local_18;
  CallInst *instruction_local;
  Impl *impl_local;
  
  base_ptr = impl->root_constant_id;
  local_18 = instruction;
  instruction_local = (CallInst *)impl;
  local_20 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
  pmVar2 = std::
           unordered_map<const_LLVMBC::Value_*,_unsigned_int,_std::hash<const_LLVMBC::Value_*>,_std::equal_to<const_LLVMBC::Value_*>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_unsigned_int>_>_>
           ::operator[](&impl->handle_to_root_member_offset,&local_20);
  bVar1 = emit_cbuffer_load_from_uints
                    (impl,instruction,base_ptr,StorageClassPushConstant,*pmVar2,
                     *(int *)&instruction_local[0xf].super_Instruction.attachments._M_h.
                              _M_before_begin._M_nxt +
                     *(int *)((long)&instruction_local[0xf].super_Instruction.attachments._M_h.
                                     _M_bucket_count + 4));
  return bVar1;
}

Assistant:

static bool emit_cbuffer_load_root_constant(Converter::Impl &impl, const llvm::CallInst *instruction)
{
	return emit_cbuffer_load_from_uints(impl, instruction,
	                                    impl.root_constant_id,
	                                    spv::StorageClassPushConstant,
	                                    impl.handle_to_root_member_offset[instruction->getOperand(1)],
	                                    impl.root_constant_num_words + impl.root_descriptor_count);
}